

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::closeBeamlet_abi_cxx11_
          (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,Station *this,int beam,int aperture,bool lside)

{
  undefined8 uVar1;
  bool bVar2;
  pair<int,_int> pVar3;
  long lVar4;
  int i;
  int iVar5;
  int iVar6;
  long lVar7;
  value_type local_58;
  _List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_48;
  
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node._M_size = 0;
  bVar2 = isActiveBeamlet(this,beam);
  if (!bVar2) goto LAB_00116b96;
  bVar2 = isOpenBeamlet(this,beam,aperture);
  if (!bVar2) goto LAB_00116b96;
  pVar3 = Collimator::indexToPos(this->collimator,beam,this->angle);
  lVar7 = ((long)pVar3 << 0x20) >> 0x1d;
  iVar6 = pVar3.second;
  if (lside) {
    iVar5 = 0;
    while( true ) {
      lVar4 = *(long *)&(this->A).
                        super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[aperture].
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data;
      if (iVar6 - *(int *)(lVar4 + lVar7) < iVar5) break;
      local_58.first = *(int *)(lVar4 + lVar7) + (beam - iVar6) + iVar5;
      local_58.second =
           -(this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[aperture];
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      push_back(__return_storage_ptr__,&local_58);
      iVar5 = iVar5 + 1;
    }
    uVar1 = *(undefined8 *)(lVar4 + lVar7);
    (this->last_mem).first.first = aperture;
    (this->last_mem).first.second = pVar3.first;
    (this->last_mem).second.first = (int)uVar1;
    (this->last_mem).second.second = (int)((ulong)uVar1 >> 0x20);
    if (*(int *)(lVar4 + 4 + lVar7) == iVar6) {
LAB_00116b62:
      *(undefined8 *)(lVar4 + lVar7) = 0xffffffffffffffff;
    }
    else {
      *(int *)(lVar4 + lVar7) = iVar6 + 1;
    }
  }
  else {
    for (iVar5 = 0;
        lVar4 = *(long *)&(this->A).
                          super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[aperture].
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data,
        iVar5 <= *(int *)(lVar4 + 4 + lVar7) - iVar6; iVar5 = iVar5 + 1) {
      local_58.first = beam + iVar5;
      local_58.second =
           -(this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[aperture];
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      push_back(__return_storage_ptr__,&local_58);
    }
    uVar1 = *(undefined8 *)(lVar4 + lVar7);
    (this->last_mem).first.first = aperture;
    (this->last_mem).first.second = pVar3.first;
    (this->last_mem).second.first = (int)uVar1;
    (this->last_mem).second.second = (int)((ulong)uVar1 >> 0x20);
    if (*(int *)(lVar4 + lVar7) == iVar6) goto LAB_00116b62;
    *(int *)(lVar4 + 4 + lVar7) = iVar6 + -1;
  }
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_48,
             __return_storage_ptr__);
  updateIntensity(this,(list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       &local_48);
  std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
  _M_clear(&local_48);
LAB_00116b96:
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
            (&this->last_diff,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

list<pair <int,double> > Station::closeBeamlet(int beam, int aperture, bool lside) {
    
    list<pair <int, double> > diff;
    //cout << "Attempt to close beam: " << beam << " from left? " << lside << endl;
    //cout << "active: " << isActiveBeamlet(beam) << "open: " << isOpenBeamlet(beam, aperture) << endl;

    if (isActiveBeamlet(beam) && isOpenBeamlet(beam, aperture)) {
      auto coord = collimator.indexToPos(beam, angle);
      int row= coord.first;
      //cout << "Coordinates: " << coord.first << "," << coord.second << endl;
      if (lside) {
        //cout << "lside" << endl;
        for (int i=0;i<=coord.second-A[aperture][row].first;i++) {
          diff.push_back(make_pair(beam-(coord.second-A[aperture][row].first)+i, -intensity[aperture]));
          //cout << "el diff es " << beam-(coord.second-A[aperture][row].first)+i <<"," << -intensity[aperture] << endl; 
        }
        last_mem = make_pair(make_pair(aperture,row), A[aperture][row]);
        if (A[aperture][row].second == coord.second) {
          A[aperture][row].first = -1;
          A[aperture][row].second = -1;
        } else {
          A[aperture][row].first = coord.second+1;
        }
      } else {
        for (int i=0;i<=A[aperture][row].second-coord.second;i++) {
          diff.push_back(make_pair(beam+i, -intensity[aperture]));
	      }
        last_mem = make_pair(make_pair(aperture,row), A[aperture][row]);
	      if (A[aperture][row].first == coord.second) {
	        A[aperture][row].first=-1;
	        A[aperture][row].second=-1;
	      } else {
          A[aperture][row].second=coord.second-1;
        }
      }
      updateIntensity(diff);
    }
    last_diff=diff;
    return(diff);
  }